

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Matchers::Impl::StdString::StartsWith::~StartsWith(StartsWith *this)

{
  StartsWith *in_RDI;
  
  ~StartsWith(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

Matchers::Impl::StdString::StartsWith::~StartsWith() {}